

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O3

int __thiscall ProtocolARP::LocateProtocolAddress(ProtocolARP *this,uint8_t *protocolAddress)

{
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    sVar1 = ProtocolIPv4::AddressSize(this->IP);
    uVar2 = sVar1 & 0xffffffff;
    do {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) {
        if (uVar2 == 0xffffffffffffffff) goto LAB_00105a35;
        break;
      }
      uVar3 = (uint)uVar2 & 0x7fffffff;
    } while (this->Cache[lVar4].IPv4Address[uVar3] == protocolAddress[uVar3]);
    lVar4 = lVar4 + 1;
    if (lVar4 == 5) {
      lVar4 = 0xffffffff;
LAB_00105a35:
      return (int)lVar4;
    }
  } while( true );
}

Assistant:

int ProtocolARP::LocateProtocolAddress(const uint8_t* protocolAddress)
{
    int i;
    int j;

    for (i = 0; i < ARPCacheSize; i++)
    {
        // Go through the address backwards since least significant byte is most
        // likely to be unique
        for (j = IP.AddressSize() - 1; j >= 0; j--)
        {
            if (Cache[i].IPv4Address[j] != protocolAddress[j])
            {
                break;
            }
        }
        if (j == -1)
        {
            // found
            return i;
        }
    }

    return -1;
}